

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

SQRESULT sq_arrayreverse(HSQUIRRELVM v,SQInteger idx)

{
  SQOuter *pSVar1;
  ulong uVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  SQObjectPtr *o;
  SQObjectPtr t;
  
  if (v->_stackbase < v->_top) {
    bVar3 = sq_aux_gettypedarg(v,idx,OT_ARRAY,&o);
    if (bVar3) {
      pSVar1 = (o->super_SQObject)._unVal.pOuter;
      uVar2 = pSVar1->_idx;
      if (0 < (long)uVar2) {
        t.super_SQObject._type = OT_NULL;
        t.super_SQObject._unVal.pTable = (SQTable *)0x0;
        uVar4 = uVar2 >> 1;
        lVar5 = 0;
        lVar6 = uVar2 << 4;
        while( true ) {
          bVar3 = uVar4 == 0;
          uVar4 = uVar4 - 1;
          if (bVar3) break;
          SQObjectPtr::operator=
                    (&t,(SQObjectPtr *)((long)&(pSVar1->_valptr->super_SQObject)._type + lVar5));
          SQObjectPtr::operator=
                    ((SQObjectPtr *)((long)&(pSVar1->_valptr->super_SQObject)._type + lVar5),
                     (SQObjectPtr *)((long)&pSVar1->_valptr[-1].super_SQObject._type + lVar6));
          SQObjectPtr::operator=
                    ((SQObjectPtr *)((long)&pSVar1->_valptr[-1].super_SQObject._type + lVar6),&t);
          lVar5 = lVar5 + 0x10;
          lVar6 = lVar6 + -0x10;
        }
        SQObjectPtr::~SQObjectPtr(&t);
      }
      return 0;
    }
  }
  else {
    SQVM::Raise_Error(v,"not enough params in the stack");
  }
  return -1;
}

Assistant:

SQRESULT sq_arrayreverse(HSQUIRRELVM v,SQInteger idx)
{
    sq_aux_paramscheck(v, 1);
    SQObjectPtr *o;
    _GETSAFE_OBJ(v, idx, OT_ARRAY,o);
    SQArray *arr = _array(*o);
    if(arr->Size() > 0) {
        SQObjectPtr t;
        SQInteger size = arr->Size();
        SQInteger n = size >> 1; size -= 1;
        for(SQInteger i = 0; i < n; i++) {
            t = arr->_values[i];
            arr->_values[i] = arr->_values[size-i];
            arr->_values[size-i] = t;
        }
        return SQ_OK;
    }
    return SQ_OK;
}